

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O0

void __thiscall amrex::CArena::PrintUsage(CArena *this,ostream *os,string *name,string *space)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  string *in_RCX;
  string *in_RDX;
  ostream *in_RSI;
  CArena *in_RDI;
  Long actual_megabytes;
  Long megabytes;
  
  sVar1 = heap_space_used(in_RDI);
  sVar2 = heap_space_actually_used(in_RDI);
  poVar3 = std::operator<<(in_RSI,in_RCX);
  poVar3 = std::operator<<(poVar3,"[");
  poVar3 = std::operator<<(poVar3,in_RDX);
  poVar3 = std::operator<<(poVar3,"] space allocated (MB): ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar1 >> 0x14);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(in_RSI,in_RCX);
  poVar3 = std::operator<<(poVar3,"[");
  poVar3 = std::operator<<(poVar3,in_RDX);
  poVar3 = std::operator<<(poVar3,"] space used      (MB): ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2 >> 0x14);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(in_RSI,in_RCX);
  poVar3 = std::operator<<(poVar3,"[");
  poVar3 = std::operator<<(poVar3,in_RDX);
  poVar3 = std::operator<<(poVar3,"]: ");
  sVar4 = std::
          vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
          ::size(&in_RDI->m_alloc);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," allocs, ");
  sVar5 = std::
          unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
          ::size((unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                  *)0x123619b);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  poVar3 = std::operator<<(poVar3," busy blocks, ");
  sVar6 = std::
          set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
          ::size((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                  *)0x12361ca);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
  std::operator<<(poVar3," free blocks\n");
  return;
}

Assistant:

void
CArena::PrintUsage (std::ostream& os, std::string const& name, std::string const& space) const
{
    Long megabytes = heap_space_used() / (1024*1024);
    Long actual_megabytes = heap_space_actually_used() / (1024*1024);
    os << space << "[" << name << "] space allocated (MB): " << megabytes << "\n";
    os << space << "[" << name << "] space used      (MB): " << actual_megabytes << "\n";
    os << space << "[" << name << "]: " << m_alloc.size() << " allocs, "
       << m_busylist.size() << " busy blocks, " << m_freelist.size() << " free blocks\n";
}